

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O2

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,char32_t **value)

{
  char32_t **in_RDX;
  string sStack_38;
  
  PrintToString<char32_t*>(&sStack_38,(iutest *)value,in_RDX);
  std::operator<<((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(string *)&sStack_38
                 );
  std::__cxx11::string::~string((string *)&sStack_38);
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }